

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_ptr.hpp
# Opt level: O2

element_type * __thiscall
nonstd::vptr::value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>::
value(value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *this)

{
  element_type *peVar1;
  bad_value_access *this_00;
  
  peVar1 = (this->ptr).ptr;
  if (peVar1 != (element_type *)0x0) {
    return peVar1;
  }
  this_00 = (bad_value_access *)__cxa_allocate_exception(0x10);
  bad_value_access::bad_value_access(this_00);
  __cxa_throw(this_00,&bad_value_access::typeinfo,std::logic_error::~logic_error);
}

Assistant:

pointer get() const nsvp_noexcept
    {
        return ptr;
    }